

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O2

void tgen_arithi(TCGContext_conflict9 *s,int c,int r0,tcg_target_long val,int cf)

{
  tcg_insn_unit *ptVar1;
  int *piVar2;
  uint r;
  uint uVar3;
  
  uVar3 = c & 0xfffffff8;
  r = c & 7;
  if (cf == 0) {
    if (r == 5) {
LAB_00b26784:
      if ((val == 1) || (val == -1)) {
        tcg_out_modrm(s,uVar3 + 0xff,(uint)(-1 < val != (r == 0)),r0);
        return;
      }
      goto LAB_00b26768;
    }
    if (r != 4) {
      if (r != 0) goto LAB_00b26807;
      goto LAB_00b26784;
    }
  }
  else {
LAB_00b26768:
    if (r != 4) goto LAB_00b26807;
  }
  if (val == 0xffffffff) {
    tcg_out_ext32u(s,r0,r0);
    return;
  }
  if ((ulong)val >> 0x20 == 0) {
    uVar3 = 0;
  }
  if (val == 0xffff) {
    tcg_out_ext16u(s,r0,r0);
    return;
  }
  if (val == 0xff) {
    tcg_out_ext8u(s,r0,r0);
    return;
  }
LAB_00b26807:
  if ((char)(tcg_insn_unit)val == val) {
    tcg_out_modrm(s,uVar3 + 0x83,r,r0);
    ptVar1 = s->code_ptr;
    s->code_ptr = ptVar1 + 1;
    *ptVar1 = (tcg_insn_unit)val;
  }
  else {
    if ((int)val != val && uVar3 != 0) {
      fprintf(_stderr,"%s:%d: tcg fatal error\n",
              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
              ,0x517);
      abort();
    }
    tcg_out_modrm(s,uVar3 + 0x81,r,r0);
    piVar2 = (int *)s->code_ptr;
    *piVar2 = (int)val;
    s->code_ptr = (tcg_insn_unit *)(piVar2 + 1);
  }
  return;
}

Assistant:

static void tgen_arithi(TCGContext *s, int c, int r0,
                        tcg_target_long val, int cf)
{
    int rexw = 0;

    if (TCG_TARGET_REG_BITS == 64) {
        rexw = c & -8;
        c &= 7;
    }

    /* ??? While INC is 2 bytes shorter than ADDL $1, they also induce
       partial flags update stalls on Pentium4 and are not recommended
       by current Intel optimization manuals.  */
    if (!cf && (c == ARITH_ADD || c == ARITH_SUB) && (val == 1 || val == -1)) {
        int is_inc = (c == ARITH_ADD) ^ (val < 0);
        if (TCG_TARGET_REG_BITS == 64) {
            /* The single-byte increment encodings are re-tasked as the
               REX prefixes.  Use the MODRM encoding.  */
            tcg_out_modrm(s, OPC_GRP5 + rexw,
                          (is_inc ? EXT5_INC_Ev : EXT5_DEC_Ev), r0);
        } else {
            tcg_out8(s, (is_inc ? OPC_INC_r32 : OPC_DEC_r32) + r0);
        }
        return;
    }

    if (c == ARITH_AND) {
        if (TCG_TARGET_REG_BITS == 64) {
            if (val == 0xffffffffu) {
                tcg_out_ext32u(s, r0, r0);
                return;
            }
            if (val == (uint32_t)val) {
                /* AND with no high bits set can use a 32-bit operation.  */
                rexw = 0;
            }
        }
        if (val == 0xffu && (r0 < 4 || TCG_TARGET_REG_BITS == 64)) {
            tcg_out_ext8u(s, r0, r0);
            return;
        }
        if (val == 0xffffu) {
            tcg_out_ext16u(s, r0, r0);
            return;
        }
    }

    if (val == (int8_t)val) {
        tcg_out_modrm(s, OPC_ARITH_EvIb + rexw, c, r0);
        tcg_out8(s, val);
        return;
    }
    if (rexw == 0 || val == (int32_t)val) {
        tcg_out_modrm(s, OPC_ARITH_EvIz + rexw, c, r0);
        tcg_out32(s, val);
        return;
    }

    tcg_abort();
}